

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltable.c
# Opt level: O3

RaviArray * raviH_new_number_array(lua_State *L,uint len,lua_Number init_value)

{
  ulong *puVar1;
  undefined1 auVar2 [16];
  char *pcVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  ulong uVar11;
  int iVar12;
  RaviArray *t;
  ulong uVar13;
  uint new_size;
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  
  t = raviH_new(L,0x40,0);
  new_size = len + 1;
  if (new_size != 0) {
    iVar12 = ravi_resize_array(L,t,new_size,0);
    if (iVar12 != 0) {
      pcVar3 = t->data;
      pcVar3[0] = '\0';
      pcVar3[1] = '\0';
      pcVar3[2] = '\0';
      pcVar3[3] = '\0';
      pcVar3[4] = '\0';
      pcVar3[5] = '\0';
      pcVar3[6] = '\0';
      pcVar3[7] = '\0';
      if (1 < new_size) {
        auVar2._8_8_ = 0;
        auVar2._0_8_ = init_value;
        auVar14 = vbroadcastsd_avx512f(auVar2);
        auVar15 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
        auVar16 = vpbroadcastq_avx512f();
        uVar13 = 0;
        do {
          auVar17 = vpbroadcastq_avx512f();
          auVar17 = vporq_avx512f(auVar17,auVar15);
          uVar11 = vpcmpuq_avx512f(auVar17,auVar16,2);
          puVar1 = (ulong *)(pcVar3 + uVar13 * 8 + 8);
          bVar4 = (bool)((byte)uVar11 & 1);
          bVar5 = (bool)((byte)(uVar11 >> 1) & 1);
          bVar6 = (bool)((byte)(uVar11 >> 2) & 1);
          bVar7 = (bool)((byte)(uVar11 >> 3) & 1);
          bVar8 = (bool)((byte)(uVar11 >> 4) & 1);
          bVar9 = (bool)((byte)(uVar11 >> 5) & 1);
          bVar10 = (bool)((byte)(uVar11 >> 6) & 1);
          *puVar1 = (ulong)bVar4 * auVar14._0_8_ | (ulong)!bVar4 * *puVar1;
          puVar1[1] = (ulong)bVar5 * auVar14._8_8_ | (ulong)!bVar5 * puVar1[1];
          puVar1[2] = (ulong)bVar6 * auVar14._16_8_ | (ulong)!bVar6 * puVar1[2];
          puVar1[3] = (ulong)bVar7 * auVar14._24_8_ | (ulong)!bVar7 * puVar1[3];
          puVar1[4] = (ulong)bVar8 * auVar14._32_8_ | (ulong)!bVar8 * puVar1[4];
          puVar1[5] = (ulong)bVar9 * auVar14._40_8_ | (ulong)!bVar9 * puVar1[5];
          puVar1[6] = (ulong)bVar10 * auVar14._48_8_ | (ulong)!bVar10 * puVar1[6];
          puVar1[7] = (uVar11 >> 7) * auVar14._56_8_ | (ulong)!SUB81(uVar11 >> 7,0) * puVar1[7];
          uVar13 = uVar13 + 8;
        } while (((ulong)new_size + 6 & 0xfffffffffffffff8) != uVar13);
      }
      t->len = new_size;
      t->flags = t->flags | 2;
      return t;
    }
  }
  luaG_runerror(L,"array length out of range");
}

Assistant:

RaviArray *raviH_new_number_array(lua_State *L, unsigned int len,
                              lua_Number init_value) {
  RaviArray *t = raviH_new(L, RAVI_TM_FLOAT_ARRAY, 0);
  unsigned int new_len = len + 1; // Ravi arrays have an extra slot at offset 0
  if (new_len < len) { // Wrapped?
    luaG_runerror(L, "array length out of range");
  }
  if (!ravi_resize_array(L, t, new_len, 0)) {
    luaG_runerror(L, "array length out of range");
  }
  lua_Number *data = (lua_Number *)t->data;
  data[0] = 0;
  for (unsigned int i = 1; i < new_len; i++) {
    data[i] = init_value;
  }
  t->len = new_len;
  t->flags |= RAVI_ARRAY_FIXEDSIZE;
  return t;
}